

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_ostream.cpp
# Opt level: O3

void __thiscall pretty_ostream::error(pretty_ostream *this,string *message)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1m",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Error] ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\x1b[0m",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void pretty_ostream::error(string message) {
    cout << BOLD << RED << "[Error] " << message << RESET << endl;
}